

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

void __thiscall Assimp::CFIReaderImpl::QName::QName(QName *this,FIQName *qname)

{
  size_t sVar1;
  char *pcVar2;
  allocator<char> local_31;
  
  pcVar2 = qname->prefix;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "";
  }
  (this->prefix)._M_dataplus._M_p = (pointer)&(this->prefix).field_2;
  sVar1 = strlen(pcVar2);
  std::__cxx11::string::_M_construct<char_const*>((string *)this,pcVar2,pcVar2 + sVar1);
  pcVar2 = qname->uri;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "";
  }
  (this->uri)._M_dataplus._M_p = (pointer)&(this->uri).field_2;
  sVar1 = strlen(pcVar2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->uri,pcVar2,pcVar2 + sVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->name,qname->name,&local_31);
  return;
}

Assistant:

inline QName(const FIQName &qname): prefix(qname.prefix ? qname.prefix : ""), uri(qname.uri ? qname.uri : ""), name(qname.name) {}